

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void drawnumber_motionfn(void *z,t_floatarg dx,t_floatarg dy,t_floatarg up)

{
  float fVar1;
  t_scalar *sc;
  _glist *owner;
  t_template *template;
  int iVar2;
  t_symbol *s;
  _instancetemplate *p_Var3;
  t_atom at;
  
  if ((up == 0.0) && (!NAN(up))) {
    iVar2 = gpointer_check((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0xf0),0);
    if (iVar2 == 0) {
      post("drawnumber_motion: scalar disappeared");
      return;
    }
    p_Var3 = (pd_maininstance.pd_gui)->i_template;
    if (*(int *)(p_Var3 + 0x108) == 0) {
      fVar1 = *(float *)(p_Var3 + 0xc0);
      *(float *)(p_Var3 + 0xc0) = fVar1 - dy;
      template_setfloat(*(t_template **)(p_Var3 + 0xe8),*(t_symbol **)((long)z + 0x30),
                        *(t_word **)(p_Var3 + 0xe0),fVar1 - dy,1);
      p_Var3 = (pd_maininstance.pd_gui)->i_template;
      sc = *(t_scalar **)(p_Var3 + 0xd0);
      if (sc != (t_scalar *)0x0) {
        owner = *(_glist **)(p_Var3 + 200);
        template = *(t_template **)(p_Var3 + 0xe8);
        s = gensym("change");
        template_notifyforscalar(template,owner,sc,s,1,&at);
        p_Var3 = (pd_maininstance.pd_gui)->i_template;
        if (*(t_scalar **)(p_Var3 + 0xd0) != (t_scalar *)0x0) {
          scalar_redraw(*(t_scalar **)(p_Var3 + 0xd0),*(_glist **)(p_Var3 + 200));
          p_Var3 = (pd_maininstance.pd_gui)->i_template;
        }
      }
      if (*(_array **)(p_Var3 + 0xd8) != (_array *)0x0) {
        array_redraw(*(_array **)(p_Var3 + 0xd8),*(_glist **)(p_Var3 + 200));
      }
    }
  }
  return;
}

Assistant:

static void drawnumber_motionfn(void *z, t_floatarg dx, t_floatarg dy,
    t_floatarg up)
{
    t_drawnumber *x = (t_drawnumber *)z;
    t_atom at;
    if (up != 0)
        return;
    if (!gpointer_check(&TEMPLATE->drawnumber_motion_gpointer, 0))
    {
        post("drawnumber_motion: scalar disappeared");
        return;
    }
    if (TEMPLATE->drawnumber_motion_type != DT_FLOAT)
        return;
    TEMPLATE->drawnumber_motion_ycumulative -= dy;
    template_setfloat(TEMPLATE->drawnumber_motion_template,
        x->x_fieldname,
            TEMPLATE->drawnumber_motion_wp,
            TEMPLATE->drawnumber_motion_ycumulative,
                1);
    if (TEMPLATE->drawnumber_motion_scalar)
        template_notifyforscalar(TEMPLATE->drawnumber_motion_template,
            TEMPLATE->drawnumber_motion_glist,
                TEMPLATE->drawnumber_motion_scalar,
                gensym("change"), 1, &at);

    if (TEMPLATE->drawnumber_motion_scalar)
        scalar_redraw(TEMPLATE->drawnumber_motion_scalar,
            TEMPLATE->drawnumber_motion_glist);
    if (TEMPLATE->drawnumber_motion_array)
        array_redraw(TEMPLATE->drawnumber_motion_array,
            TEMPLATE->drawnumber_motion_glist);
}